

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_TestShell::
~TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_TestShell
          (TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_TestShell *this)

{
  TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_TestShell *this_local;
  
  ~TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValues_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongLongIntegerReturnValueSetsDifferentValues)
{
    long long int expected_value = 1;
    long long int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    LONGLONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, mock().returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_expected_value, mock().returnValue().getLongLongIntValue());
}